

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_syntax.cpp
# Opt level: O3

ParserResult *
parse_variable_declaration
          (ParserResult *__return_storage_ptr__,ParserContext *parser,token_iterator begin,
          token_iterator end)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _func_void_storage_union_ptr *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  ParserResult *pPVar6;
  bool bVar7;
  SyntaxTree *pSVar8;
  undefined1 auVar9 [8];
  initializer_list<ParserError> IL;
  pair<const_TokenStream::TokenData_*,_eggs::variants::variant<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>_>
  rule_result;
  ParserState idents;
  size_type __dnew;
  anon_class_1_0_00000001 local_271;
  shared_ptr<SyntaxTree> local_270;
  undefined1 local_260 [24];
  undefined1 local_248 [8];
  undefined1 auStack_240 [88];
  undefined1 local_1e8 [48];
  ParserResult *local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [80];
  size_t local_158;
  anon_union_80_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>_3
  local_148;
  long local_f8;
  undefined1 local_e8 [8];
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  local_e0;
  ParserState local_88;
  
  if ((begin == end) || (local_1b0 = (ulong)begin->type, 7 < begin->type - VAR_INT)) {
    make_error<ParserStatus,TokenStream::TokenData_const*&>
              ((ParserState *)local_248,(ParserStatus *)0x0,(TokenData **)begin);
    __return_storage_ptr__->first = end;
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&__return_storage_ptr__->second,
               (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)local_248);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                *)local_248);
    return __return_storage_ptr__;
  }
  local_148._64_8_ = 0;
  local_148._72_8_ = 0;
  local_148._48_8_ = 0;
  local_148._56_8_ = 0;
  local_148._32_8_ = 0;
  local_148._40_8_ = 0;
  local_148._16_8_ = 0;
  local_148._24_8_ = 0;
  local_148._0_8_ = 0;
  local_148._8_8_ = 0;
  local_f8 = 0;
  pSVar8 = (SyntaxTree *)operator_new(0x88);
  (pSVar8->parent_).super_OptionalBase<std::weak_ptr<SyntaxTree>_>.storage_.dummy_ = '\0';
  (pSVar8->udata).vtable = (vtable_type *)0x0;
  (pSVar8->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (pSVar8->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pSVar8->childs).
  super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar8->childs).
  super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(pSVar8->childs).
           super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(pSVar8->childs).
           super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (pSVar8->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
  super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (pSVar8->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
  super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pSVar8->type_ = Block;
  std::__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
            ((__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2> *)local_1e8,pSVar8);
  auVar9 = (undefined1  [8])(begin + 1);
  local_1a8._0_8_ = (SyntaxTree *)0x0;
  local_1a8._8_8_ = (token_iterator)0x0;
  local_158 = 1;
  local_260._16_8_ = begin;
  local_1b8 = __return_storage_ptr__;
  if (auVar9 != (undefined1  [8])end) {
    do {
      if (*(Token *)&(((SyntaxTree *)auVar9)->super_enable_shared_from_this<SyntaxTree>).
                     _M_weak_this.super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          NewLine) break;
      parse_identifier((ParserResult *)local_248,parser,(token_iterator)auVar9,end);
      bVar7 = eggs::variants::detail::
              apply<bool,is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,false,false>const&>
                        (&local_271,
                         (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                          *)auStack_240);
      if (bVar7) {
        bVar7 = eggs::variants::detail::
                apply<bool,is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,false,false>const&>
                          (&local_271,
                           (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                            *)local_1a8);
        if (bVar7) {
          if ((void *)auStack_240._80_8_ != (void *)0x1) {
            eggs::variants::detail::throw_bad_variant_access<ParserSuccess&>();
          }
          local_270.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)auStack_240._0_8_;
          local_270.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_240._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_240._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(auStack_240._8_8_ + 8) =
                   *(_Atomic_word *)(auStack_240._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(auStack_240._8_8_ + 8) =
                   *(_Atomic_word *)(auStack_240._8_8_ + 8) + 1;
            }
          }
          SyntaxTree::add_child((SyntaxTree *)local_1e8._0_8_,&local_270);
          if (local_270.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_270.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      else {
        if ((void *)auStack_240._80_8_ != (void *)0x2) {
          eggs::variants::detail::
          throw_bad_variant_access<llvm_vecsmall::SmallVector<ParserError,1u>&>();
        }
        add_error((ParserState *)local_1a8,(ParserFailure *)auStack_240._0_8_);
      }
      auVar9 = local_248;
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                  *)auStack_240);
    } while (auVar9 != (undefined1  [8])end);
  }
  bVar7 = eggs::variants::detail::
          apply<bool,is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,false,false>const&>
                    ((anon_class_1_0_00000001 *)local_248,
                     (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                      *)local_1a8);
  pPVar6 = local_1b8;
  uVar5 = local_1e8._8_8_;
  uVar4 = local_1e8._0_8_;
  local_e8 = auVar9;
  if (bVar7) {
    local_1e8._0_8_ = (SyntaxTree *)0x0;
    local_1e8._8_8_ = (vtable_type *)0x0;
    local_e0.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._0_8_ = uVar4;
    local_e0.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    .
    super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
    .field_0._8_8_ = uVar5;
    local_e0.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    ._which = 1;
  }
  else {
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage(&local_e0.
                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
               ,(_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                 *)local_1a8);
  }
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
              *)local_1a8);
  if ((vtable_type *)local_1e8._8_8_ != (vtable_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
  }
  auVar9 = local_e8;
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  ::operator=((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
               *)&local_148._tail,&local_e0);
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  ::_destroy(&local_e0);
  if (auVar9 != (undefined1  [8])end) {
    if (*(Token *)&(((enable_shared_from_this<SyntaxTree> *)auVar9)->_M_weak_this).
                   super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr != NewLine) {
      __assert_fail("it->type == Token::NewLine",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/parser_syntax.cpp"
                    ,0x36b,
                    "ParserResult parse_variable_declaration(ParserContext &, token_iterator, token_iterator)"
                   );
    }
    auVar9 = (undefined1  [8])((long)auVar9 + 0x18);
  }
  bVar7 = eggs::variants::detail::
          apply<bool,is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,false,false>const&>
                    ((anon_class_1_0_00000001 *)local_248,
                     (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                      *)&local_148._tail);
  if (bVar7) {
    if (local_f8 != 1) {
      eggs::variants::detail::throw_bad_variant_access<ParserSuccess&>();
    }
    if (*(long *)(local_148._0_8_ + 0x48) == *(long *)(local_148._0_8_ + 0x40)) {
      local_e8 = (undefined1  [8])0x24;
      local_270.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_260;
      local_1e8._16_8_ = std::__cxx11::string::_M_create((ulong *)&local_270,(ulong)local_e8);
      *(undefined8 *)&((element_type *)local_1e8._16_8_)->type_ = 0x6574666120726569;
      ((U *)&((element_type *)local_1e8._16_8_)->token)->__align =
           (anon_struct_8_0_00000001_for___align)0x7420736968742072;
      (((SmallVectorImpl<ParserError> *)
       &((element_type *)local_1e8._16_8_)->super_enable_shared_from_this<SyntaxTree>)->
      super_SmallVectorTemplateBase<ParserError,_false>).
      super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.BeginX =
           (void *)0x6465746365707865;
      (((SmallVectorImpl<ParserError> *)
       &((element_type *)local_1e8._16_8_)->super_enable_shared_from_this<SyntaxTree>)->
      super_SmallVectorTemplateBase<ParserError,_false>).
      super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX =
           (void *)0x6669746e65646920;
      *(undefined4 *)((long)&((element_type *)local_1e8._16_8_)->token + 8) = 0x6e656b6f;
      *(undefined1 *)
       ((long)&(((SmallVectorImpl<ParserError> *)
                &((element_type *)local_1e8._16_8_)->super_enable_shared_from_this<SyntaxTree>)->
               super_SmallVectorTemplateBase<ParserError,_false>).
               super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.BeginX +
       (long)&(((enable_shared_from_this<SyntaxTree> *)local_e8)->_M_weak_this).
              super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr) = 0;
      peVar1 = (element_type *)(local_1a8 + 0x20);
      local_1a8._0_4_ = 1;
      local_1a8._8_8_ = local_260._16_8_;
      if ((element_type *)local_1e8._16_8_ == (element_type *)local_260) {
        local_1a8._40_8_ = local_260._8_8_;
        local_1e8._16_8_ = peVar1;
      }
      local_270.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_260._0_8_ = (ulong)local_e8 & 0xffffffffffffff00;
      local_1e8._0_8_ = local_1a8._0_8_;
      local_1e8._8_8_ = local_260._16_8_;
      if ((element_type *)local_1e8._16_8_ == peVar1) {
        local_1e8._40_8_ = local_1a8._40_8_;
        local_1e8._16_8_ = (element_type *)(local_1e8 + 0x20);
      }
      local_1e8._32_8_ = local_e8;
      local_1e8._24_8_ = local_e8;
      local_1a8._24_8_ = 0;
      local_1a8._32_8_ = (ulong)local_e8 & 0xffffffffffffff00;
      IL._M_len = 1;
      IL._M_array = (iterator)local_1e8;
      local_270.super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_260;
      local_1a8._16_8_ = peVar1;
      llvm_vecsmall::SmallVector<ParserError,_1U>::SmallVector
                ((SmallVector<ParserError,_1U> *)local_e8,IL);
      llvm_vecsmall::SmallVector<ParserError,_1U>::SmallVector
                ((SmallVector<ParserError,_1U> *)local_248,(SmallVector<ParserError,_1U> *)local_e8)
      ;
      auStack_240._72_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
      llvm_vecsmall::SmallVectorImpl<ParserError>::~SmallVectorImpl
                ((SmallVectorImpl<ParserError> *)local_e8);
      if ((element_type *)local_1e8._16_8_ != (element_type *)(local_1e8 + 0x20)) {
        operator_delete((void *)local_1e8._16_8_,(ulong)(local_1e8._32_8_ + 1));
      }
      if ((element_type *)local_1a8._16_8_ != peVar1) {
        operator_delete((void *)local_1a8._16_8_,local_1a8._32_8_ + 1);
      }
      pPVar6->first = (TokenData *)auVar9;
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)&pPVar6->second,
                 (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                  *)local_248);
      eggs::variants::detail::
      _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
      ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                  *)local_248);
      goto LAB_00199859;
    }
  }
  bVar7 = eggs::variants::detail::
          apply<bool,is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,false,false>const&>
                    ((anon_class_1_0_00000001 *)local_248,
                     (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                      *)&local_148._tail);
  if (bVar7) {
    pSVar8 = (SyntaxTree *)operator_new(0x88);
    (pSVar8->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
    super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (pSVar8->super_enable_shared_from_this<SyntaxTree>)._M_weak_this.
    super___weak_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pSVar8->type_ = (int)local_1b0 - Command;
    p_Var3 = *(_func_void_storage_union_ptr **)(local_260._16_8_ + 8);
    *(_func_type_info_ptr **)&pSVar8->token = *(_func_type_info_ptr **)local_260._16_8_;
    (pSVar8->token).begin = (size_t)p_Var3;
    (pSVar8->token).end =
         (size_t)*(_func_void_storage_union_ptr_storage_union_ptr **)(local_260._16_8_ + 0x10);
    (pSVar8->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (parser->instream).
             super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (parser->instream).
             super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (pSVar8->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (pSVar8->parent_).super_OptionalBase<std::weak_ptr<SyntaxTree>_>.storage_.dummy_ = '\0';
    (pSVar8->udata).vtable = (vtable_type *)0x0;
    (pSVar8->childs).
    super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar8->childs).
    super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(pSVar8->childs).
             super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&(pSVar8->childs).
             super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
    std::__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SyntaxTree,void>
              ((__shared_ptr<SyntaxTree,(__gnu_cxx::_Lock_policy)2> *)local_248,pSVar8);
    if (local_f8 != 1) {
      eggs::variants::detail::throw_bad_variant_access<ParserSuccess&>();
    }
    SyntaxTree::take_childs((SyntaxTree *)local_248,(shared_ptr<SyntaxTree> *)&local_148._tail);
    pPVar6->first = (TokenData *)auVar9;
    *(undefined1 (*) [8])
     &(pPVar6->second)._storage.
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      .
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
      .
      super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
      .field_0 = local_248;
    *(undefined8 *)
     ((long)&(pPVar6->second)._storage.
             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
             .
             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
             .
             super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
             .field_0 + 8) = auStack_240._0_8_;
    (pPVar6->second)._storage.
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    ._which = 1;
  }
  else {
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&local_88,
               (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&local_148._tail);
    giveup_to_expected((ParserState *)local_248,&local_88,"identifier");
    pPVar6->first = (TokenData *)auVar9;
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)&pPVar6->second,
               (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)local_248);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
                *)local_248);
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
    ::_destroy(&local_88._storage);
  }
LAB_00199859:
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
  ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_false>
              *)&local_148._tail);
  return pPVar6;
}

Assistant:

static ParserResult parse_variable_declaration(ParserContext& parser, token_iterator begin, token_iterator end)
{
    if(begin != end)
    {
        NodeType type = begin->type == Token::VAR_INT? NodeType::VAR_INT :
                        begin->type == Token::LVAR_INT? NodeType::LVAR_INT :
                        begin->type == Token::VAR_FLOAT? NodeType::VAR_FLOAT :
                        begin->type == Token::LVAR_FLOAT? NodeType::LVAR_FLOAT :
                        begin->type == Token::VAR_TEXT_LABEL? NodeType::VAR_TEXT_LABEL :
                        begin->type == Token::LVAR_TEXT_LABEL? NodeType::LVAR_TEXT_LABEL :
                        begin->type == Token::VAR_TEXT_LABEL16? NodeType::VAR_TEXT_LABEL16 :
                        begin->type == Token::LVAR_TEXT_LABEL16? NodeType::LVAR_TEXT_LABEL16 :
                                                                   NodeType::Block;

        if(type != NodeType::Block)
        {
            auto it = std::next(begin);
            ParserState idents;

            std::tie(it, idents) = parse_until_if(parse_identifier, parser, it, end, [](token_iterator t) {
                return t->type == Token::NewLine;
            });

            if(it != end)
            {
                assert(it->type == Token::NewLine);
                ++it;
            }

            if(is<ParserSuccess>(idents) && get<ParserSuccess>(idents).tree->child_count() == 0)
            {
                return std::make_pair(it, make_error(ParserStatus::Error, begin, "expected identifier after this token"));
            }

            if(is<ParserSuccess>(idents))
            {
                shared_ptr<SyntaxTree> tree(new SyntaxTree(type, parser.instream, *begin));
                tree->take_childs(get<ParserSuccess>(idents).tree);
                return std::make_pair(it, ParserSuccess(std::move(tree)));
            }
            else
            {
                return std::make_pair(it, giveup_to_expected(std::move(idents), "identifier"));
            }
        }
    }
    return std::make_pair(end, make_error(ParserStatus::GiveUp, begin));
}